

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkInterface * __thiscall
cmGeneratorTarget::GetLinkInterface(cmGeneratorTarget *this,string *config,cmGeneratorTarget *head)

{
  _Base_ptr p_Var1;
  bool bVar2;
  cmLinkInterface *pcVar3;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  mapped_type *iface;
  mapped_type *pmVar4;
  cmGeneratorTarget *local_20;
  
  local_20 = head;
  if (this->Target->IsImportedTarget != true) {
    if ((this->Target->TargetTypeValue != EXECUTABLE) ||
       (bVar2 = IsExecutableWithExports(this), bVar2)) {
      this_00 = &GetHeadToLinkInterfaceMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
      if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
         *(char *)((long)&p_Var1[4]._M_left + 4) != '\0')) {
        iface = std::
                map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                ::operator[](this_00,&local_20);
        if ((iface->super_cmLinkInterface).field_0x69 == '\0') {
          (iface->super_cmLinkInterface).field_0x69 = 1;
          ComputeLinkInterfaceLibraries(this,config,iface,local_20,false);
        }
        if (((iface->super_cmLinkInterface).field_0x6a == '\0') &&
           ((iface->super_cmLinkInterface).field_0x6a = 1,
           (iface->super_cmLinkInterface).field_0x6b == '\x01')) {
          ComputeLinkInterface(this,config,iface,local_20);
        }
        pmVar4 = (mapped_type *)0x0;
        if ((iface->super_cmLinkInterface).field_0x6b != '\0') {
          pmVar4 = iface;
        }
      }
      else {
        pmVar4 = (mapped_type *)&p_Var1[1]._M_parent;
      }
    }
    else {
      pmVar4 = (mapped_type *)0x0;
    }
    return &pmVar4->super_cmLinkInterface;
  }
  pcVar3 = GetImportLinkInterface(this,config,head,false);
  return pcVar3;
}

Assistant:

cmLinkInterface const* cmGeneratorTarget::GetLinkInterface(
  const std::string& config, cmGeneratorTarget const* head) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, false);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm = this->GetHeadToLinkInterfaceMap(config);

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head, false);
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    if (iface.Exists) {
      this->ComputeLinkInterface(config, iface, head);
    }
  }

  return iface.Exists ? &iface : nullptr;
}